

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall
BN::expLeftToRightK_aryMod
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  pointer puVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  puVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1) < 3) && (*puVar1 == 0)) {
    bn1();
  }
  else {
    bn1();
    uVar5 = (ulong)((long)(exponent->ba).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(exponent->ba).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 1 & 0xffffffff;
    while( true ) {
      uVar5 = uVar5 - 1;
      if ((int)(uint)uVar5 < 0) break;
      for (uVar4 = 1; uVar4 < 2; uVar4 = uVar4 - 1) {
        uVar2 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start[(uint)uVar5 & 0x7fffffff] >>
                ((char)uVar4 * '\b' & 0x1fU);
        uVar3 = uVar2 & 0xff;
        uVar6 = 0;
        uVar7 = uVar6;
        if ((char)uVar2 != '\0') {
          for (; uVar7 = uVar6, (uVar3 & 1) == 0; uVar3 = uVar3 >> 1) {
            uVar6 = uVar6 + 1;
          }
        }
        for (; uVar6 < 8; uVar6 = uVar6 + 1) {
          Qrt((BN *)&local_60,__return_storage_ptr__);
          operator%((BN *)&local_48,(BN *)&local_60,mod);
          operator=(__return_storage_ptr__,(BN *)&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_60);
        }
        karatsubaMultiplication
                  ((BN *)&local_60,__return_storage_ptr__,
                   (g->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                   _M_start + uVar3);
        operator%((BN *)&local_48,(BN *)&local_60,mod);
        operator=(__return_storage_ptr__,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
        while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
          Qrt((BN *)&local_60,__return_storage_ptr__);
          operator%((BN *)&local_48,(BN *)&local_60,mod);
          operator=(__return_storage_ptr__,(BN *)&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_60);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_aryMod(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        for (size_t b = bz - 1; b < bz; --b) {
            bt ei = (exponent.ba[i] >> KaryBits * b) & KaryMask;

            size_t hi = 0;
            if(ei != 0) {
                while(! (ei & 1)) {
                    ei >>= 1;
                    hi++;
                }
            }

            for(size_t k = 0; k + hi < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[ei] % mod;
            for(size_t k = 0; k < hi; k++)
                A = A.Qrt() % mod;
        }
    }
    return A;

}